

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

string * __thiscall
flatbuffers::lobster::LobsterGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Type *type)

{
  BaseType BVar1;
  size_t sVar2;
  char *__s;
  allocator<char> local_31;
  string local_30;
  
  BVar1 = type->base_type;
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                         (ulong)BVar1 * 8),&local_31);
    ConvertCase(__return_storage_ptr__,&local_30,kUpperCamel,kSnake);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (BVar1 == BASE_TYPE_STRUCT) {
      __s = "UOffsetTRelative";
      if (type->struct_def->fixed != false) {
        __s = "Struct";
      }
    }
    else {
      __s = "UOffsetTRelative";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMethod(const Type &type) {
    return IsScalar(type.base_type)
               ? ConvertCase(GenTypeBasic(type), Case::kUpperCamel)
               : (IsStruct(type) ? "Struct" : "UOffsetTRelative");
  }